

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ClockingDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::EventExpressionSyntax&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,EventExpressionSyntax *args_5,
          Token *args_6,SyntaxList<slang::syntax::MemberSyntax> *args_7,Token *args_8,
          NamedBlockClauseSyntax **args_9)

{
  Token globalOrDefault;
  Token clocking;
  Token blockName;
  Token at;
  Token semi;
  Token endClocking;
  ClockingDeclarationSyntax *this_00;
  
  this_00 = (ClockingDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ClockingDeclarationSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ClockingDeclarationSyntax *)allocateSlow(this,0xf8,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  globalOrDefault.kind = args_1->kind;
  globalOrDefault._2_1_ = args_1->field_0x2;
  globalOrDefault.numFlags.raw = (args_1->numFlags).raw;
  globalOrDefault.rawLen = args_1->rawLen;
  globalOrDefault.info = args_1->info;
  clocking.kind = args_2->kind;
  clocking._2_1_ = args_2->field_0x2;
  clocking.numFlags.raw = (args_2->numFlags).raw;
  clocking.rawLen = args_2->rawLen;
  clocking.info = args_2->info;
  endClocking.kind = args_8->kind;
  endClocking._2_1_ = args_8->field_0x2;
  endClocking.numFlags.raw = (args_8->numFlags).raw;
  endClocking.rawLen = args_8->rawLen;
  endClocking.info = args_8->info;
  semi.kind = args_6->kind;
  semi._2_1_ = args_6->field_0x2;
  semi.numFlags.raw = (args_6->numFlags).raw;
  semi.rawLen = args_6->rawLen;
  semi.info = args_6->info;
  at.kind = args_4->kind;
  at._2_1_ = args_4->field_0x2;
  at.numFlags.raw = (args_4->numFlags).raw;
  at.rawLen = args_4->rawLen;
  at.info = args_4->info;
  blockName.kind = args_3->kind;
  blockName._2_1_ = args_3->field_0x2;
  blockName.numFlags.raw = (args_3->numFlags).raw;
  blockName.rawLen = args_3->rawLen;
  blockName.info = args_3->info;
  slang::syntax::ClockingDeclarationSyntax::ClockingDeclarationSyntax
            (this_00,args,globalOrDefault,clocking,blockName,at,args_5,semi,args_7,endClocking,
             *args_9);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }